

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

void print_object_type(CrispyValue value)

{
  ulong uVar1;
  
  uVar1 = (ulong)(value.field_1.o_value)->type;
  if (uVar1 < 4) {
    puts(&DAT_0010746c + *(int *)(&DAT_0010746c + uVar1 * 4));
    return;
  }
  puts(" : OBJECT");
  return;
}

Assistant:

void print_object_type(CrispyValue value) {
    Object *object = value.o_value;

    switch (object->type) {
        case OBJ_STRING:
            printf(" : STRING\n");
            break;
        case OBJ_LAMBDA:
            printf(" : LAMBDA\n");
            break;
        case OBJ_DICT:
            printf(" : DICT\n");
            break;
        default:
            printf(" : OBJECT\n");
            break;
    }
}